

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsCreateExternalArrayBuffer
          (void *data,uint byteLength,JsFinalizeCallback finalizeCallback,void *callbackState,
          JsValueRef *result)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  JsrtExternalArrayBuffer *pJVar3;
  JsErrorCode JVar4;
  AutoNestedHandledExceptionType local_78 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    JVar4 = JsErrorNoCurrentContext;
  }
  else {
    pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_78,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTAllocateExternalArrayBuffer
                (pSVar1->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
                 (byte *)data,byteLength);
    }
    if (result == (JsValueRef *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      JVar4 = JsErrorInvalidArgument;
      if (data != (void *)0x0 || byteLength == 0) {
        pJVar3 = Js::JsrtExternalArrayBuffer::New
                           ((byte *)data,byteLength,finalizeCallback,callbackState,
                            (((pSVar1->super_ScriptContextBase).javascriptLibrary)->arrayBufferType)
                            .ptr);
        *result = pJVar3;
        JVar4 = JsNoError;
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
          *(JsrtExternalArrayBuffer **)_actionEntryPopper.m_actionEvent = pJVar3;
          JVar4 = JsNoError;
        }
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_78);
    if (auStack_48 != (undefined1  [8])0x0) {
      if (*(int32 *)((long)auStack_48 + 4) != -1) {
        TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
      }
      *(JsErrorCode *)((long)auStack_48 + 4) = JVar4;
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsCreateExternalArrayBuffer(_Pre_maybenull_ _Pre_writable_byte_size_(byteLength) void *data, _In_ unsigned int byteLength,
    _In_opt_ JsFinalizeCallback finalizeCallback, _In_opt_ void *callbackState, _Out_ JsValueRef *result)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalArrayBuffer, reinterpret_cast<BYTE*>(data), byteLength);

        PARAM_NOT_NULL(result);

        if (data == nullptr && byteLength > 0)
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptLibrary* library = scriptContext->GetLibrary();
        *result = Js::JsrtExternalArrayBuffer::New(
            reinterpret_cast<BYTE*>(data),
            byteLength,
            finalizeCallback,
            callbackState,
            library->GetArrayBufferType());

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*result));
        return JsNoError;
    });
}